

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int decode_one(MMDB_s *mmdb,uint32_t offset,MMDB_entry_data_s *entry_data)

{
  byte ctrl_00;
  byte bVar1;
  uint32_t uVar2;
  int32_t iVar3;
  uint64_t uVar4;
  mmdb_uint128_t *pmVar5;
  uint length;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  undefined8 extraout_RDX;
  float fVar6;
  double dVar7;
  uint8_t *local_68;
  uint local_40;
  uint32_t size;
  uint8_t psize;
  int type;
  uint8_t ctrl;
  uint8_t *mem;
  MMDB_entry_data_s *entry_data_local;
  uint32_t offset_local;
  MMDB_s *mmdb_local;
  
  local_68 = mmdb->data_section;
  if (mmdb->data_section_size - 1 < offset) {
    mmdb_local._4_4_ = 7;
  }
  else {
    entry_data->offset = offset;
    entry_data->has_data = true;
    length = offset + 1;
    ctrl_00 = local_68[offset];
    size = (int)(uint)ctrl_00 >> 5;
    entry_data_local._4_4_ = length;
    if (size == 0) {
      if (mmdb->data_section_size - 1 < length) {
        return 7;
      }
      entry_data_local._4_4_ = offset + 2;
      size = get_ext_type((uint)local_68[length]);
      length = extraout_EDX;
    }
    entry_data->type = size;
    if (size == 1) {
      bVar1 = ((byte)((int)(uint)ctrl_00 >> 3) & 3) + 1;
      if ((mmdb->data_section_size - (uint)bVar1 < entry_data_local._4_4_) ||
         (mmdb->data_section_size < (uint)bVar1)) {
        mmdb_local._4_4_ = 7;
      }
      else {
        uVar2 = get_ptr_from(ctrl_00,local_68 + entry_data_local._4_4_,(uint)bVar1);
        (entry_data->field_1).pointer = uVar2;
        entry_data->data_size = (uint)bVar1;
        entry_data->offset_to_next = entry_data_local._4_4_ + bVar1;
        mmdb_local._4_4_ = 0;
      }
    }
    else {
      local_40 = ctrl_00 & 0x1f;
      if (local_40 == 0x1d) {
        if (mmdb->data_section_size - 1 < entry_data_local._4_4_) {
          return 7;
        }
        length = entry_data_local._4_4_ + 1;
        local_40 = local_68[entry_data_local._4_4_] + 0x1d;
        entry_data_local._4_4_ = length;
      }
      else if (local_40 == 0x1e) {
        if (mmdb->data_section_size - 2 < entry_data_local._4_4_) {
          return 7;
        }
        uVar2 = get_uint16(local_68 + entry_data_local._4_4_);
        local_40 = uVar2 + 0x11d;
        length = extraout_EDX_00;
        entry_data_local._4_4_ = entry_data_local._4_4_ + 2;
      }
      else if (local_40 == 0x1f) {
        if (mmdb->data_section_size - 3 < entry_data_local._4_4_) {
          return 7;
        }
        uVar2 = get_uint24(local_68 + entry_data_local._4_4_);
        local_40 = uVar2 + 0x1011d;
        length = extraout_EDX_01;
        entry_data_local._4_4_ = entry_data_local._4_4_ + 3;
      }
      if ((size == 7) || (size == 0xb)) {
        entry_data->data_size = local_40;
        entry_data->offset_to_next = entry_data_local._4_4_;
        mmdb_local._4_4_ = 0;
      }
      else if (size == 0xe) {
        (entry_data->field_1).boolean = local_40 != 0;
        entry_data->data_size = 0;
        entry_data->offset_to_next = entry_data_local._4_4_;
        mmdb_local._4_4_ = 0;
      }
      else if ((mmdb->data_section_size - local_40 < entry_data_local._4_4_) ||
              (mmdb->data_section_size < local_40)) {
        mmdb_local._4_4_ = 7;
      }
      else {
        if (size == 5) {
          if (2 < local_40) {
            return 7;
          }
          uVar4 = get_uintX(local_68 + entry_data_local._4_4_,local_40);
          (entry_data->field_1).uint16 = (uint16_t)uVar4;
        }
        else if (size == 6) {
          if (4 < local_40) {
            return 7;
          }
          uVar4 = get_uintX(local_68 + entry_data_local._4_4_,local_40);
          (entry_data->field_1).pointer = (uint32_t)uVar4;
        }
        else if (size == 8) {
          if (4 < local_40) {
            return 7;
          }
          iVar3 = get_sintX(local_68 + entry_data_local._4_4_,local_40);
          (entry_data->field_1).int32 = iVar3;
        }
        else if (size == 9) {
          if (8 < local_40) {
            return 7;
          }
          uVar4 = get_uintX(local_68 + entry_data_local._4_4_,local_40);
          (entry_data->field_1).uint64 = uVar4;
        }
        else if (size == 10) {
          if (0x10 < local_40) {
            return 7;
          }
          pmVar5 = get_uint128((mmdb_uint128_t *)(local_68 + entry_data_local._4_4_),
                               (uint8_t *)(ulong)local_40,length);
          *(undefined8 *)((long)&entry_data->field_1 + 8) = extraout_RDX;
          (entry_data->field_1).bytes = (uint8_t *)pmVar5;
        }
        else if (size == 0xf) {
          if (local_40 != 4) {
            return 7;
          }
          local_40 = 4;
          fVar6 = get_ieee754_float(local_68 + entry_data_local._4_4_);
          (entry_data->field_1).float_value = fVar6;
        }
        else if (size == 3) {
          if (local_40 != 8) {
            return 7;
          }
          local_40 = 8;
          dVar7 = get_ieee754_double(local_68 + entry_data_local._4_4_);
          (entry_data->field_1).double_value = dVar7;
        }
        else if (size == 2) {
          if (local_40 == 0) {
            local_68 = "";
          }
          else {
            local_68 = local_68 + entry_data_local._4_4_;
          }
          (entry_data->field_1).utf8_string = (char *)local_68;
          entry_data->data_size = local_40;
        }
        else if (size == 4) {
          (entry_data->field_1).utf8_string = (char *)(local_68 + entry_data_local._4_4_);
          entry_data->data_size = local_40;
        }
        entry_data->offset_to_next = entry_data_local._4_4_ + local_40;
        mmdb_local._4_4_ = 0;
      }
    }
  }
  return mmdb_local._4_4_;
}

Assistant:

static int decode_one(const MMDB_s *const mmdb,
                      uint32_t offset,
                      MMDB_entry_data_s *entry_data) {
    const uint8_t *mem = mmdb->data_section;

    // We subtract rather than add as it possible that offset + 1
    // could overflow for a corrupt database while an underflow
    // from data_section_size - 1 should not be possible.
    if (offset > mmdb->data_section_size - 1) {
        DEBUG_MSGF("Offset (%d) past data section (%d)",
                   offset,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    entry_data->offset = offset;
    entry_data->has_data = true;

    DEBUG_NL;
    DEBUG_MSGF("Offset: %i", offset);

    uint8_t ctrl = mem[offset++];
    DEBUG_BINARY("Control byte: %s", ctrl);

    int type = (ctrl >> 5) & 7;
    DEBUG_MSGF("Type: %i (%s)", type, type_num_to_name(type));

    if (type == MMDB_DATA_TYPE_EXTENDED) {
        // Subtracting 1 to avoid possible overflow on offset + 1
        if (offset > mmdb->data_section_size - 1) {
            DEBUG_MSGF("Extended type offset (%d) past data section (%d)",
                       offset,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        type = get_ext_type(mem[offset++]);
        DEBUG_MSGF("Extended type: %i (%s)", type, type_num_to_name(type));
    }

    entry_data->type = (uint32_t)type;

    if (type == MMDB_DATA_TYPE_POINTER) {
        uint8_t psize = ((ctrl >> 3) & 3) + 1;
        DEBUG_MSGF("Pointer size: %i", psize);

        // We check that the offset does not extend past the end of the
        // database and that the subtraction of psize did not underflow.
        if (offset > mmdb->data_section_size - psize ||
            mmdb->data_section_size < psize) {
            DEBUG_MSGF("Pointer offset (%d) past data section (%d)",
                       offset + psize,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->pointer = get_ptr_from(ctrl, &mem[offset], psize);
        DEBUG_MSGF("Pointer to: %i", entry_data->pointer);

        entry_data->data_size = psize;
        entry_data->offset_to_next = offset + psize;
        return MMDB_SUCCESS;
    }

    uint32_t size = ctrl & 31;
    switch (size) {
        case 29:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 1) {
                DEBUG_MSGF("String end (%d, case 29) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 29 + mem[offset++];
            break;
        case 30:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 2) {
                DEBUG_MSGF("String end (%d, case 30) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 285 + get_uint16(&mem[offset]);
            offset += 2;
            break;
        case 31:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 3) {
                DEBUG_MSGF("String end (%d, case 31) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 65821 + get_uint24(&mem[offset]);
            offset += 3;
            break;
        default:
            break;
    }

    DEBUG_MSGF("Size: %i", size);

    if (type == MMDB_DATA_TYPE_MAP || type == MMDB_DATA_TYPE_ARRAY) {
        entry_data->data_size = size;
        entry_data->offset_to_next = offset;
        return MMDB_SUCCESS;
    }

    if (type == MMDB_DATA_TYPE_BOOLEAN) {
        entry_data->boolean = size ? true : false;
        entry_data->data_size = 0;
        entry_data->offset_to_next = offset;
        DEBUG_MSGF("boolean value: %s", entry_data->boolean ? "true" : "false");
        return MMDB_SUCCESS;
    }

    // Check that the data doesn't extend past the end of the memory
    // buffer and that the calculation in doing this did not underflow.
    if (offset > mmdb->data_section_size - size ||
        mmdb->data_section_size < size) {
        DEBUG_MSGF("Data end (%d) past data section (%d)",
                   offset + size,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    if (type == MMDB_DATA_TYPE_UINT16) {
        if (size > 2) {
            DEBUG_MSGF("uint16 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint16 = (uint16_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint16 value: %u", entry_data->uint16);
    } else if (type == MMDB_DATA_TYPE_UINT32) {
        if (size > 4) {
            DEBUG_MSGF("uint32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint32 = (uint32_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint32 value: %u", entry_data->uint32);
    } else if (type == MMDB_DATA_TYPE_INT32) {
        if (size > 4) {
            DEBUG_MSGF("int32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->int32 = get_sintX(&mem[offset], (int)size);
        DEBUG_MSGF("int32 value: %i", entry_data->int32);
    } else if (type == MMDB_DATA_TYPE_UINT64) {
        if (size > 8) {
            DEBUG_MSGF("uint64 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint64 = get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint64 value: %" PRIu64, entry_data->uint64);
    } else if (type == MMDB_DATA_TYPE_UINT128) {
        if (size > 16) {
            DEBUG_MSGF("uint128 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
#if MMDB_UINT128_IS_BYTE_ARRAY
        memset(entry_data->uint128, 0, 16);
        if (size > 0) {
            memcpy(entry_data->uint128 + 16 - size, &mem[offset], size);
        }
#else
        entry_data->uint128 = get_uint128(&mem[offset], (int)size);
#endif
    } else if (type == MMDB_DATA_TYPE_FLOAT) {
        if (size != 4) {
            DEBUG_MSGF("float of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 4;
        entry_data->float_value = get_ieee754_float(&mem[offset]);
        DEBUG_MSGF("float value: %f", entry_data->float_value);
    } else if (type == MMDB_DATA_TYPE_DOUBLE) {
        if (size != 8) {
            DEBUG_MSGF("double of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 8;
        entry_data->double_value = get_ieee754_double(&mem[offset]);
        DEBUG_MSGF("double value: %f", entry_data->double_value);
    } else if (type == MMDB_DATA_TYPE_UTF8_STRING) {
        entry_data->utf8_string = size == 0 ? "" : (char const *)&mem[offset];
        entry_data->data_size = size;
#ifdef MMDB_DEBUG
        char *string =
            mmdb_strndup(entry_data->utf8_string, size > 50 ? 50 : size);
        if (NULL == string) {
            abort();
        }
        DEBUG_MSGF("string value: %s", string);
        free(string);
#endif
    } else if (type == MMDB_DATA_TYPE_BYTES) {
        entry_data->bytes = &mem[offset];
        entry_data->data_size = size;
    }

    entry_data->offset_to_next = offset + size;

    return MMDB_SUCCESS;
}